

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall
QDockAreaLayoutItem::QDockAreaLayoutItem(QDockAreaLayoutItem *this,QDockAreaLayoutItem *other)

{
  QDockAreaLayoutInfo *pQVar1;
  QPlaceHolderItem *pQVar2;
  int iVar3;
  QDockAreaLayoutInfo *this_00;
  QPlaceHolderItem *this_01;
  
  this->widgetItem = other->widgetItem;
  this->subinfo = (QDockAreaLayoutInfo *)0x0;
  this->placeHolderItem = (QPlaceHolderItem *)0x0;
  iVar3 = other->size;
  this->pos = other->pos;
  this->size = iVar3;
  this->flags = other->flags;
  pQVar1 = other->subinfo;
  if (pQVar1 == (QDockAreaLayoutInfo *)0x0) {
    pQVar2 = other->placeHolderItem;
    if (pQVar2 != (QPlaceHolderItem *)0x0) {
      this_01 = (QPlaceHolderItem *)operator_new(0x30);
      QPlaceHolderItem::QPlaceHolderItem(this_01,pQVar2);
      this->placeHolderItem = this_01;
    }
  }
  else {
    this_00 = (QDockAreaLayoutInfo *)operator_new(0x70);
    QDockAreaLayoutInfo::QDockAreaLayoutInfo(this_00,pQVar1);
    this->subinfo = this_00;
  }
  return;
}

Assistant:

QDockAreaLayoutItem::QDockAreaLayoutItem(const QDockAreaLayoutItem &other)
    : widgetItem(other.widgetItem), subinfo(nullptr), placeHolderItem(nullptr), pos(other.pos),
        size(other.size), flags(other.flags)
{
    if (other.subinfo != nullptr)
        subinfo = new QDockAreaLayoutInfo(*other.subinfo);
    else if (other.placeHolderItem != nullptr)
        placeHolderItem = new QPlaceHolderItem(*other.placeHolderItem);
}